

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stats.c
# Opt level: O1

void stats_print_helper(emitter_t *emitter,_Bool merged,_Bool destroyed,_Bool unmerged,_Bool bins,
                       _Bool large,_Bool mutex,_Bool extents)

{
  emitter_justify_t *peVar1;
  byte *oldp;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  long lVar7;
  undefined1 auVar8 [8];
  size_t sVar9;
  int iVar10;
  int iVar11;
  anon_struct_8_1_803fbc3e_for_cols aVar12;
  anon_struct_8_1_803fbc3e_for_cols aVar13;
  char *format;
  emitter_row_t eVar14;
  ulong uVar15;
  uint uVar16;
  char *pcVar17;
  emitter_justify_t *peVar18;
  bool bVar19;
  undefined8 uStack_370;
  undefined1 local_368 [8];
  size_t sz;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_358 [4];
  undefined4 local_338;
  anon_union_8_10_2a69db89_for_emitter_col_s_3 local_330;
  undefined4 local_310;
  ulong local_308 [4];
  undefined4 local_2e8;
  ulong local_2e0;
  undefined4 local_2c0;
  ulong local_2b8 [4];
  undefined4 local_298;
  ulong local_290;
  undefined4 local_270;
  ulong local_268 [4];
  undefined4 local_248;
  ulong local_240;
  undefined4 local_220;
  ulong local_218 [4];
  undefined4 local_1f8;
  ulong local_1f0;
  undefined4 local_1d0;
  undefined1 local_1c8 [32];
  size_t local_1a8;
  size_t mib [7];
  undefined1 local_120 [8];
  emitter_col_t name;
  emitter_col_t col32 [1];
  size_t metadata_thp;
  size_t resident;
  size_t mapped;
  size_t retained;
  uint64_t uptime;
  size_t sz_10;
  undefined8 local_98;
  size_t allocated;
  size_t active;
  size_t metadata;
  size_t num_background_threads;
  uint64_t background_thread_num_runs;
  uint64_t background_thread_run_interval;
  emitter_row_t row;
  size_t local_38;
  size_t miblen;
  
  aVar13.qlh_first = (emitter_col_t *)local_368;
  aVar12.qlh_first = (emitter_col_t *)local_368;
  local_368 = (undefined1  [8])0x8;
  uStack_370 = 0x1411df;
  iVar10 = je_mallctl("stats.allocated",&local_98,(size_t *)local_368,(void *)0x0,0);
  if (iVar10 == 0) {
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x14120d;
    iVar10 = je_mallctl("stats.active",&allocated,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.active";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x141238;
    iVar10 = je_mallctl("stats.metadata",&active,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.metadata";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x141266;
    iVar10 = je_mallctl("stats.metadata_thp",&col32[0].link.qre_prev,(size_t *)local_368,(void *)0x0
                        ,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.metadata_thp";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x141294;
    iVar10 = je_mallctl("stats.resident",&metadata_thp,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.resident";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x1412c2;
    iVar10 = je_mallctl("stats.mapped",&resident,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.mapped";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x1412f0;
    iVar10 = je_mallctl("stats.retained",&mapped,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.retained";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x14131b;
    iVar10 = je_mallctl("stats.background_thread.num_threads",&metadata,(size_t *)local_368,
                        (void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.background_thread.num_threads";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x141346;
    iVar10 = je_mallctl("stats.background_thread.num_runs",&num_background_threads,
                        (size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.background_thread.num_runs";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    local_368 = (undefined1  [8])0x8;
    uStack_370 = 0x141371;
    iVar10 = je_mallctl("stats.background_thread.run_interval",&background_thread_num_runs,
                        (size_t *)local_368,(void *)0x0,0);
    if (iVar10 != 0) {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "stats.background_thread.run_interval";
      aVar12.qlh_first = (emitter_col_t *)local_368;
      goto LAB_00142160;
    }
    uStack_370 = 0x141388;
    emitter_json_object_kv_begin(emitter,"stats");
    uStack_370 = 0x1413a3;
    emitter_json_kv(emitter,"allocated",emitter_type_size,&local_98);
    uStack_370 = 0x1413be;
    emitter_json_kv(emitter,"active",emitter_type_size,&allocated);
    uStack_370 = 0x1413d6;
    emitter_json_kv(emitter,"metadata",emitter_type_size,&active);
    uStack_370 = 0x1413f4;
    emitter_json_kv(emitter,"metadata_thp",emitter_type_size,&col32[0].link.qre_prev);
    uStack_370 = 0x141412;
    emitter_json_kv(emitter,"resident",emitter_type_size,&metadata_thp);
    uStack_370 = 0x141430;
    emitter_json_kv(emitter,"mapped",emitter_type_size,&resident);
    uStack_370 = 0x14144e;
    emitter_json_kv(emitter,"retained",emitter_type_size,&mapped);
    emitter_table_printf
              (emitter,
               "Allocated: %zu, active: %zu, metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, retained: %zu\n"
               ,local_98,allocated,active,col32[0].link.qre_prev,metadata_thp,resident,mapped);
    uStack_370 = 0x1414a3;
    emitter_json_object_kv_begin(emitter,"background_thread");
    uStack_370 = 0x1414bb;
    emitter_json_kv(emitter,"num_threads",emitter_type_size,&metadata);
    uStack_370 = 0x1414d3;
    emitter_json_kv(emitter,"num_runs",emitter_type_uint64,&num_background_threads);
    uStack_370 = 0x1414eb;
    emitter_json_kv(emitter,"run_interval",emitter_type_uint64,&background_thread_num_runs);
    if (emitter->output == emitter_output_json) {
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      uStack_370 = 0x141508;
      emitter_printf(emitter,"\n");
      pcVar17 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar17 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar10 = 1;
        if (1 < iVar11) {
          iVar10 = iVar11;
        }
        do {
          uStack_370 = 0x141550;
          emitter_printf(emitter,"%s",pcVar17);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      uStack_370 = 0x141566;
      emitter_printf(emitter,"}");
    }
    uStack_370 = 0x141587;
    emitter_table_printf
              (emitter,"Background threads: %zu, num_runs: %lu, run_interval: %lu ns\n",metadata);
    if (mutex) {
      background_thread_run_interval = 0;
      uStack_370 = 0x1415bc;
      mutex_stats_init_cols
                ((emitter_row_t *)&background_thread_run_interval,"",(emitter_col_t *)local_120,
                 (emitter_col_t *)local_368,(emitter_col_t *)&name.link.qre_prev);
      peVar18 = (emitter_justify_t *)background_thread_run_interval;
      if (emitter->output == emitter_output_table) {
        while (peVar18 != (emitter_justify_t *)0x0) {
          uStack_370 = 0x1415e1;
          emitter_print_value(emitter,*peVar18,peVar18[1],peVar18[2],peVar18 + 4);
          peVar1 = peVar18 + 6;
          peVar18 = *(emitter_justify_t **)peVar1;
          if (*(emitter_justify_t **)peVar1 == (emitter_justify_t *)background_thread_run_interval)
          {
            peVar18 = (emitter_justify_t *)0x0;
          }
        }
        uStack_370 = 0x141601;
        emitter_table_printf(emitter,"\n");
      }
      uStack_370 = 0x141610;
      emitter_json_object_kv_begin(emitter,"mutexes");
      local_38 = 7;
      uptime = 8;
      uStack_370 = 0x141639;
      iVar10 = je_mallctlnametomib("stats.arenas.0.uptime",&local_1a8,&local_38);
      if (iVar10 != 0) {
        format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
        pcVar17 = "stats.arenas.0.uptime";
        aVar12.qlh_first = (emitter_col_t *)local_368;
        goto LAB_00142160;
      }
      mib[1] = 0;
      uStack_370 = 0x141671;
      iVar10 = je_mallctlbymib(&local_1a8,local_38,&retained,&uptime,(void *)0x0,0);
      if (iVar10 != 0) goto LAB_0014216c;
      aVar12.qlh_first = (emitter_col_t *)0x0;
      do {
        sVar9 = retained;
        pcVar17 = global_mutex_names[(long)aVar12.qlh_first];
        sz = CONCAT44(sz._4_4_,4);
        uStack_370 = 0x1416db;
        name._8_8_ = pcVar17;
        row.cols.qlh_first =
             (anon_struct_8_1_803fbc3e_for_cols)(anon_struct_8_1_803fbc3e_for_cols)aVar12.qlh_first;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,"num_ops");
        local_38 = 8;
        uStack_370 = 0x1416fa;
        iVar10 = je_mallctl((char *)&local_1a8,local_358,&local_38,(void *)0x0,0);
        if (iVar10 != 0) {
LAB_00142152:
          format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
          pcVar17 = (char *)&local_1a8;
          aVar12.qlh_first = (emitter_col_t *)local_368;
          goto LAB_00142160;
        }
        local_338 = 4;
        if (local_358[0].uint64_val == 0 || sVar9 == 0) {
          local_330.uint64_val = 0;
        }
        else {
          local_330 = local_358[0];
          if (999999999 < sVar9) {
            auVar2._8_8_ = 0;
            auVar2._0_8_ = local_358[0].uint64_val;
            local_330.uint64_val =
                 SUB168(auVar2 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                 (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_310 = 4;
        uStack_370 = 0x14178a;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,"num_wait");
        local_38 = 8;
        uStack_370 = 0x1417a9;
        iVar10 = je_mallctl((char *)&local_1a8,local_308,&local_38,(void *)0x0,0);
        if (iVar10 != 0) goto LAB_00142152;
        local_2e8 = 4;
        if (local_308[0] == 0 || sVar9 == 0) {
          local_2e0 = 0;
        }
        else {
          local_2e0 = local_308[0];
          if (999999999 < sVar9) {
            auVar3._8_8_ = 0;
            auVar3._0_8_ = local_308[0];
            local_2e0 = SUB168(auVar3 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_2c0 = 4;
        uStack_370 = 0x141839;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,"num_spin_acq");
        local_38 = 8;
        uStack_370 = 0x141858;
        iVar10 = je_mallctl((char *)&local_1a8,local_2b8,&local_38,(void *)0x0,0);
        if (iVar10 != 0) goto LAB_00142152;
        local_298 = 4;
        if (local_2b8[0] == 0 || sVar9 == 0) {
          local_290 = 0;
        }
        else {
          local_290 = local_2b8[0];
          if (999999999 < sVar9) {
            auVar4._8_8_ = 0;
            auVar4._0_8_ = local_2b8[0];
            local_290 = SUB168(auVar4 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_270 = 4;
        uStack_370 = 0x1418e8;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,
                        "num_owner_switch");
        local_38 = 8;
        uStack_370 = 0x141907;
        iVar10 = je_mallctl((char *)&local_1a8,local_268,&local_38,(void *)0x0,0);
        if (iVar10 != 0) goto LAB_00142152;
        local_248 = 4;
        if (local_268[0] == 0 || sVar9 == 0) {
          local_240 = 0;
        }
        else {
          local_240 = local_268[0];
          if (999999999 < sVar9) {
            auVar5._8_8_ = 0;
            auVar5._0_8_ = local_268[0];
            local_240 = SUB168(auVar5 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_220 = 4;
        uStack_370 = 0x141997;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,"total_wait_time"
                       );
        local_38 = 8;
        uStack_370 = 0x1419b6;
        iVar10 = je_mallctl((char *)&local_1a8,local_218,&local_38,(void *)0x0,0);
        if (iVar10 != 0) goto LAB_00142152;
        local_1f8 = 4;
        if (local_218[0] == 0 || sVar9 == 0) {
          local_1f0 = 0;
        }
        else {
          local_1f0 = local_218[0];
          if (999999999 < sVar9) {
            auVar6._8_8_ = 0;
            auVar6._0_8_ = local_218[0];
            local_1f0 = SUB168(auVar6 / (ZEXT816(0) * ZEXT816(0x44b82fa09b5a53) >> 0x4b &
                                        (undefined1  [16])0x1fffffffffffff),0);
          }
        }
        local_1d0 = 4;
        uStack_370 = 0x141a49;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s","mutexes",pcVar17,"max_wait_time");
        local_38 = 8;
        uStack_370 = 0x141a68;
        iVar10 = je_mallctl((char *)&local_1a8,local_1c8,&local_38,(void *)0x0,0);
        if (iVar10 != 0) goto LAB_00142152;
        col32[0].justify = emitter_justify_none|emitter_justify_right;
        uStack_370 = 0x141a99;
        malloc_snprintf((char *)&local_1a8,0x80,"stats.%s.%s.%s");
        local_38 = 4;
        uStack_370 = 0x141ab8;
        iVar10 = je_mallctl((char *)&local_1a8,&col32[0].type,&local_38,(void *)0x0,0);
        eVar14 = row;
        if (iVar10 != 0) goto LAB_00142152;
        uStack_370 = 0x141adb;
        emitter_json_object_kv_begin(emitter,global_mutex_names[(long)row.cols.qlh_first]);
        uStack_370 = 0x141af5;
        mutex_stats_emit(emitter,(emitter_row_t *)&background_thread_run_interval,
                         (emitter_col_t *)local_368,(emitter_col_t *)&name.link.qre_prev);
        if (emitter->output == emitter_output_json) {
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          uStack_370 = 0x141b20;
          emitter_printf(emitter,"\n");
          pcVar17 = "\t";
          if (emitter->output != emitter_output_json) {
            pcVar17 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar10 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            if (iVar10 < 2) {
              iVar10 = 1;
            }
            do {
              uStack_370 = 0x141b6e;
              emitter_printf(emitter,"%s",pcVar17);
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          uStack_370 = 0x141b84;
          emitter_printf(emitter,"}");
          eVar14 = row;
        }
        aVar12.qlh_first =
             (emitter_col_t *)((long)&((emitter_col_t *)eVar14.cols.qlh_first)->justify + 1);
      } while (aVar12.qlh_first != (emitter_col_t *)0x3);
      if (emitter->output == emitter_output_json) {
        emitter->nesting_depth = emitter->nesting_depth + -1;
        emitter->item_at_depth = true;
        uStack_370 = 0x141bcf;
        emitter_printf(emitter,"\n");
        pcVar17 = "\t";
        if (emitter->output != emitter_output_json) {
          pcVar17 = " ";
        }
        if (0 < emitter->nesting_depth) {
          iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
          iVar10 = 1;
          if (1 < iVar11) {
            iVar10 = iVar11;
          }
          do {
            uStack_370 = 0x141c17;
            emitter_printf(emitter,"%s",pcVar17);
            iVar10 = iVar10 + -1;
          } while (iVar10 != 0);
        }
        uStack_370 = 0x141c2d;
        emitter_printf(emitter,"}");
      }
    }
    if (emitter->output == emitter_output_json) {
      emitter->nesting_depth = emitter->nesting_depth + -1;
      emitter->item_at_depth = true;
      uStack_370 = 0x141c4a;
      emitter_printf(emitter,"\n");
      pcVar17 = "\t";
      if (emitter->output != emitter_output_json) {
        pcVar17 = " ";
      }
      if (0 < emitter->nesting_depth) {
        iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
        iVar10 = 1;
        if (1 < iVar11) {
          iVar10 = iVar11;
        }
        do {
          uStack_370 = 0x141c92;
          emitter_printf(emitter,"%s",pcVar17);
          iVar10 = iVar10 + -1;
        } while (iVar10 != 0);
      }
      uStack_370 = 0x141ca8;
      emitter_printf(emitter,"}");
    }
    if ((!merged && !destroyed) && !unmerged) {
      return;
    }
    uStack_370 = 0x141cc8;
    emitter_json_object_kv_begin(emitter,"stats.arenas");
    local_368 = (undefined1  [8])0x4;
    uStack_370 = 0x141ceb;
    iVar10 = je_mallctl("arenas.narenas",&local_38,(size_t *)local_368,(void *)0x0,0);
    if (iVar10 == 0) {
      local_120 = (undefined1  [8])0x3;
      lVar7 = -((local_38 & 0xffffffff) + 0xf & 0xfffffffffffffff0);
      aVar13.qlh_first = (emitter_col_t *)(local_368 + lVar7);
      row.cols.qlh_first =
           (anon_struct_8_1_803fbc3e_for_cols)(anon_struct_8_1_803fbc3e_for_cols)aVar13.qlh_first;
      *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141d2f;
      iVar10 = je_mallctlnametomib("arena.0.initialized",(size_t *)local_368,(size_t *)local_120);
      if (iVar10 == 0) {
        if ((int)local_38 == 0) {
          bVar19 = true;
          sz_10 = (size_t)local_368;
        }
        else {
          uVar15 = 0;
          uVar16 = 0;
          sz_10 = (size_t)local_368;
          do {
            auVar8 = local_120;
            name.link.qre_prev = (emitter_col_t *)0x1;
            oldp = (byte *)((long)row.cols.qlh_first + uVar15);
            sz = uVar15;
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141d8a;
            iVar10 = je_mallctlbymib((size_t *)local_368,(size_t)auVar8,oldp,
                                     (size_t *)&name.link.qre_prev,(void *)0x0,0);
            if (iVar10 != 0) goto LAB_0014216c;
            uVar16 = uVar16 + *oldp;
            uVar15 = uVar15 + 1;
          } while (uVar15 < (local_38 & 0xffffffff));
          bVar19 = uVar16 < 2;
        }
        auVar8 = local_120;
        sz = 0x1001;
        name.link.qre_prev = (emitter_col_t *)0x1;
        *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141de5;
        iVar10 = je_mallctlbymib((size_t *)local_368,(size_t)auVar8,&background_thread_run_interval,
                                 (size_t *)&name.link.qre_prev,(void *)0x0,0);
        if (iVar10 == 0) {
          if ((merged) && ((bVar19 & unmerged) == 0)) {
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141e16;
            emitter_table_printf(emitter,"Merged arenas stats:\n");
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141e25;
            emitter_json_object_kv_begin(emitter,"merged");
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141e43;
            stats_arena_print(emitter,0x1000,bins,large,mutex,extents);
            if (emitter->output == emitter_output_json) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141e60;
              emitter_printf(emitter,"\n");
              pcVar17 = "\t";
              if (emitter->output != emitter_output_json) {
                pcVar17 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                iVar10 = 1;
                if (1 < iVar11) {
                  iVar10 = iVar11;
                }
                do {
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141ea8;
                  emitter_printf(emitter,"%s",pcVar17);
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141ebe;
              emitter_printf(emitter,"}");
            }
          }
          if ((destroyed & (byte)background_thread_run_interval) == 1) {
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141edd;
            emitter_table_printf(emitter,"Destroyed arenas stats:\n");
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141eec;
            emitter_json_object_kv_begin(emitter,"destroyed");
            *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141f0a;
            stats_arena_print(emitter,0x1001,bins,large,mutex,extents);
            if (emitter->output == emitter_output_json) {
              emitter->nesting_depth = emitter->nesting_depth + -1;
              emitter->item_at_depth = true;
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141f27;
              emitter_printf(emitter,"\n");
              pcVar17 = "\t";
              if (emitter->output != emitter_output_json) {
                pcVar17 = " ";
              }
              if (0 < emitter->nesting_depth) {
                iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                iVar10 = 1;
                if (1 < iVar11) {
                  iVar10 = iVar11;
                }
                do {
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141f6f;
                  emitter_printf(emitter,"%s",pcVar17);
                  iVar10 = iVar10 + -1;
                } while (iVar10 != 0);
              }
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141f85;
              emitter_printf(emitter,"}");
            }
          }
          if ((unmerged) && ((int)local_38 != 0)) {
            uVar15 = 0;
            do {
              if (*(char *)((long)row.cols.qlh_first + uVar15) == '\x01') {
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141ff1;
                malloc_snprintf((char *)&local_1a8,0x14,"%u",uVar15 & 0xffffffff);
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x141ffc;
                emitter_json_object_kv_begin(emitter,(char *)&local_1a8);
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x142010;
                emitter_table_printf(emitter,"arenas[%s]:\n",&local_1a8);
                *(undefined8 *)((long)&uStack_370 + lVar7) = 0x142029;
                stats_arena_print(emitter,(uint)uVar15,bins,large,mutex,extents);
                if (emitter->output == emitter_output_json) {
                  emitter->nesting_depth = emitter->nesting_depth + -1;
                  emitter->item_at_depth = true;
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14204a;
                  emitter_printf(emitter,"\n");
                  pcVar17 = "\t";
                  if (emitter->output != emitter_output_json) {
                    pcVar17 = " ";
                  }
                  if (0 < emitter->nesting_depth) {
                    iVar10 = emitter->nesting_depth << (emitter->output != emitter_output_json);
                    if (iVar10 < 2) {
                      iVar10 = 1;
                    }
                    do {
                      *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14208e;
                      emitter_printf(emitter,"%s",pcVar17);
                      iVar10 = iVar10 + -1;
                    } while (iVar10 != 0);
                  }
                  *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1420a4;
                  emitter_printf(emitter,"}");
                }
              }
              uVar15 = uVar15 + 1;
            } while (uVar15 < (local_38 & 0xffffffff));
          }
          if (emitter->output != emitter_output_json) {
            return;
          }
          emitter->nesting_depth = emitter->nesting_depth + -1;
          emitter->item_at_depth = true;
          *(undefined8 *)((long)&uStack_370 + lVar7) = 0x1420de;
          emitter_printf(emitter,"\n");
          pcVar17 = "\t";
          if (emitter->output != emitter_output_json) {
            pcVar17 = " ";
          }
          if (0 < emitter->nesting_depth) {
            iVar11 = emitter->nesting_depth << (emitter->output != emitter_output_json);
            iVar10 = 1;
            if (1 < iVar11) {
              iVar10 = iVar11;
            }
            do {
              *(undefined8 *)((long)&uStack_370 + lVar7) = 0x142126;
              emitter_printf(emitter,"%s",pcVar17);
              iVar10 = iVar10 + -1;
            } while (iVar10 != 0);
          }
          *(undefined8 *)((long)&uStack_370 + lVar7) = 0x14213c;
          emitter_printf(emitter,"}");
          return;
        }
LAB_0014216c:
        aVar13.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x142178;
        malloc_write("<jemalloc>: Failure in xmallctlbymib()\n");
        aVar13.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x14217d;
        abort();
      }
      format = "<jemalloc>: Failure in xmallctlnametomib(\"%s\", ...)\n";
      pcVar17 = "arena.0.initialized";
      aVar12.qlh_first = aVar13.qlh_first;
    }
    else {
      format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
      pcVar17 = "arenas.narenas";
      aVar12.qlh_first = (emitter_col_t *)local_368;
    }
  }
  else {
    format = "<jemalloc>: Failure in xmallctl(\"%s\", ...)\n";
    pcVar17 = "stats.allocated";
  }
LAB_00142160:
  aVar12.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x142167;
  malloc_printf(format,pcVar17);
  aVar12.qlh_first[-1].link.qre_prev = (emitter_col_t *)0x14216c;
  abort();
}

Assistant:

static void
stats_print_helper(emitter_t *emitter, bool merged, bool destroyed,
    bool unmerged, bool bins, bool large, bool mutex, bool extents) {
	/*
	 * These should be deleted.  We keep them around for a while, to aid in
	 * the transition to the emitter code.
	 */
	size_t allocated, active, metadata, metadata_thp, resident, mapped,
	    retained;
	size_t num_background_threads;
	uint64_t background_thread_num_runs, background_thread_run_interval;

	CTL_GET("stats.allocated", &allocated, size_t);
	CTL_GET("stats.active", &active, size_t);
	CTL_GET("stats.metadata", &metadata, size_t);
	CTL_GET("stats.metadata_thp", &metadata_thp, size_t);
	CTL_GET("stats.resident", &resident, size_t);
	CTL_GET("stats.mapped", &mapped, size_t);
	CTL_GET("stats.retained", &retained, size_t);

	if (have_background_thread) {
		CTL_GET("stats.background_thread.num_threads",
		    &num_background_threads, size_t);
		CTL_GET("stats.background_thread.num_runs",
		    &background_thread_num_runs, uint64_t);
		CTL_GET("stats.background_thread.run_interval",
		    &background_thread_run_interval, uint64_t);
	} else {
		num_background_threads = 0;
		background_thread_num_runs = 0;
		background_thread_run_interval = 0;
	}

	/* Generic global stats. */
	emitter_json_object_kv_begin(emitter, "stats");
	emitter_json_kv(emitter, "allocated", emitter_type_size, &allocated);
	emitter_json_kv(emitter, "active", emitter_type_size, &active);
	emitter_json_kv(emitter, "metadata", emitter_type_size, &metadata);
	emitter_json_kv(emitter, "metadata_thp", emitter_type_size,
	    &metadata_thp);
	emitter_json_kv(emitter, "resident", emitter_type_size, &resident);
	emitter_json_kv(emitter, "mapped", emitter_type_size, &mapped);
	emitter_json_kv(emitter, "retained", emitter_type_size, &retained);

	emitter_table_printf(emitter, "Allocated: %zu, active: %zu, "
	    "metadata: %zu (n_thp %zu), resident: %zu, mapped: %zu, "
	    "retained: %zu\n", allocated, active, metadata, metadata_thp,
	    resident, mapped, retained);

	/* Background thread stats. */
	emitter_json_object_kv_begin(emitter, "background_thread");
	emitter_json_kv(emitter, "num_threads", emitter_type_size,
	    &num_background_threads);
	emitter_json_kv(emitter, "num_runs", emitter_type_uint64,
	    &background_thread_num_runs);
	emitter_json_kv(emitter, "run_interval", emitter_type_uint64,
	    &background_thread_run_interval);
	emitter_json_object_end(emitter); /* Close "background_thread". */

	emitter_table_printf(emitter, "Background threads: %zu, "
	    "num_runs: %"FMTu64", run_interval: %"FMTu64" ns\n",
	    num_background_threads, background_thread_num_runs,
	    background_thread_run_interval);

	if (mutex) {
		emitter_row_t row;
		emitter_col_t name;
		emitter_col_t col64[mutex_prof_num_uint64_t_counters];
		emitter_col_t col32[mutex_prof_num_uint32_t_counters];
		uint64_t uptime;

		emitter_row_init(&row);
		mutex_stats_init_cols(&row, "", &name, col64, col32);

		emitter_table_row(emitter, &row);
		emitter_json_object_kv_begin(emitter, "mutexes");

		CTL_M2_GET("stats.arenas.0.uptime", 0, &uptime, uint64_t);

		for (int i = 0; i < mutex_prof_num_global_mutexes; i++) {
			mutex_stats_read_global(global_mutex_names[i], &name,
			    col64, col32, uptime);
			emitter_json_object_kv_begin(emitter, global_mutex_names[i]);
			mutex_stats_emit(emitter, &row, col64, col32);
			emitter_json_object_end(emitter);
		}

		emitter_json_object_end(emitter); /* Close "mutexes". */
	}

	emitter_json_object_end(emitter); /* Close "stats". */

	if (merged || destroyed || unmerged) {
		unsigned narenas;

		emitter_json_object_kv_begin(emitter, "stats.arenas");

		CTL_GET("arenas.narenas", &narenas, unsigned);
		size_t mib[3];
		size_t miblen = sizeof(mib) / sizeof(size_t);
		size_t sz;
		VARIABLE_ARRAY(bool, initialized, narenas);
		bool destroyed_initialized;
		unsigned i, j, ninitialized;

		xmallctlnametomib("arena.0.initialized", mib, &miblen);
		for (i = ninitialized = 0; i < narenas; i++) {
			mib[1] = i;
			sz = sizeof(bool);
			xmallctlbymib(mib, miblen, &initialized[i], &sz,
			    NULL, 0);
			if (initialized[i]) {
				ninitialized++;
			}
		}
		mib[1] = MALLCTL_ARENAS_DESTROYED;
		sz = sizeof(bool);
		xmallctlbymib(mib, miblen, &destroyed_initialized, &sz,
		    NULL, 0);

		/* Merged stats. */
		if (merged && (ninitialized > 1 || !unmerged)) {
			/* Print merged arena stats. */
			emitter_table_printf(emitter, "Merged arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "merged");
			stats_arena_print(emitter, MALLCTL_ARENAS_ALL, bins,
			    large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "merged". */
		}

		/* Destroyed stats. */
		if (destroyed_initialized && destroyed) {
			/* Print destroyed arena stats. */
			emitter_table_printf(emitter,
			    "Destroyed arenas stats:\n");
			emitter_json_object_kv_begin(emitter, "destroyed");
			stats_arena_print(emitter, MALLCTL_ARENAS_DESTROYED,
			    bins, large, mutex, extents);
			emitter_json_object_end(emitter); /* Close "destroyed". */
		}

		/* Unmerged stats. */
		if (unmerged) {
			for (i = j = 0; i < narenas; i++) {
				if (initialized[i]) {
					char arena_ind_str[20];
					malloc_snprintf(arena_ind_str,
					    sizeof(arena_ind_str), "%u", i);
					emitter_json_object_kv_begin(emitter,
					    arena_ind_str);
					emitter_table_printf(emitter,
					    "arenas[%s]:\n", arena_ind_str);
					stats_arena_print(emitter, i, bins,
					    large, mutex, extents);
					/* Close "<arena-ind>". */
					emitter_json_object_end(emitter);
				}
			}
		}
		emitter_json_object_end(emitter); /* Close "stats.arenas". */
	}
}